

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 int64_to_floatx80_x86_64(int64_t a,float_status *status)

{
  int iVar1;
  floatx80 fVar2;
  uint64_t local_48;
  int8_t shiftCount;
  uint64_t absA;
  flag zSign;
  float_status *status_local;
  int64_t a_local;
  uint16_t local_10;
  
  if (a == 0) {
    fVar2 = packFloatx80('\0',0,0);
    local_10 = fVar2.high;
  }
  else {
    local_48 = a;
    if (a < 0) {
      local_48 = -a;
    }
    iVar1 = clz64(local_48);
    fVar2 = packFloatx80(a < 0,0x403e - (char)(byte)iVar1,local_48 << ((byte)iVar1 & 0x3f));
    local_10 = fVar2.high;
  }
  a_local = fVar2.low;
  fVar2.high = local_10;
  fVar2.low = a_local;
  return fVar2;
}

Assistant:

floatx80 int64_to_floatx80(int64_t a, float_status *status)
{
    flag zSign;
    uint64_t absA;
    int8_t shiftCount;

    if ( a == 0 ) return packFloatx80( 0, 0, 0 );
    zSign = ( a < 0 );
    absA = zSign ? - a : a;
    shiftCount = clz64(absA);
    return packFloatx80( zSign, 0x403E - shiftCount, absA<<shiftCount );

}